

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bcatblk(bstring b,uchar *s,int len)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  tagbstring t;
  tagbstring local_20;
  
  iVar3 = -1;
  iVar4 = -1;
  if ((b != (bstring)0x0) && (iVar4 = iVar3, b->data != (uchar *)0x0)) {
    uVar2 = b->slen;
    if (((-1 < (long)(int)uVar2) &&
        (((iVar3 = b->mlen, (int)uVar2 <= iVar3 && (-1 < len)) && (s != (uchar *)0x0)))) &&
       (0 < iVar3)) {
      lVar1 = (ulong)(uint)len + (ulong)uVar2;
      iVar4 = (int)lVar1;
      if (iVar4 < iVar3) {
        if (0 < len) {
          memmove(b->data + (int)uVar2,s,(ulong)(uint)len);
        }
        b->slen = iVar4;
        b->data[lVar1] = '\0';
        iVar4 = 0;
      }
      else {
        local_20.mlen = -1;
        local_20.slen = len;
        local_20.data = s;
        iVar4 = bconcat(b,&local_20);
      }
    }
  }
  return iVar4;
}

Assistant:

int bcatblk (bstring b, const unsigned char * s, int len) {
struct tagbstring t;
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if ((nl = b->slen + len) < 0) return BSTR_ERR; /* Overflow? */
	if (nl < b->mlen) {
		bBlockCopy (&b->data[b->slen], s, len);
		b->slen = nl;
		b->data[nl] = '\0';
		return BSTR_OK;
	}
	blk2tbstr (t, s, len);
	return bconcat (b, &t);
}